

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O3

void dr_prediction_z1_32xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 (*pauVar17) [16];
  short sVar18;
  short sVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar22 [16];
  ushort uVar23;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar32;
  ushort uVar33;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar34 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar42 [16];
  __m128i dstvec [64];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined8 local_838 [128];
  undefined8 local_438 [129];
  
  if (0 < N) {
    auVar21 = pshufb(ZEXT116(above[(long)N + 0x1f]),(undefined1  [16])0x0);
    uVar4 = (ulong)(uint)N;
    puVar13 = local_438;
    puVar14 = local_838;
    uVar9 = 0;
    auVar22 = pmovsxbw(in_XMM3,0x1010101010101010);
    uVar15 = uVar4;
    uVar10 = upsample_above;
    do {
      iVar7 = (int)uVar10 >> 6;
      uVar16 = (N + 0x1f) - iVar7;
      if (uVar16 == 0 || N + 0x1f < iVar7) {
        lVar5 = 0;
        uVar12 = uVar15;
        do {
          *(undefined1 (*) [16])((long)puVar13 + lVar5) = auVar21;
          *(undefined1 (*) [16])((long)puVar14 + lVar5) = auVar21;
          lVar5 = lVar5 + 0x10;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      else {
        auVar19 = ZEXT416(uVar10 >> 1 & 0x1f);
        auVar19 = pshuflw(auVar19,auVar19,0);
        pauVar17 = &local_858;
        uVar12 = 0;
        bVar3 = true;
        do {
          bVar6 = bVar3;
          auVar34 = auVar21;
          if (uVar12 < uVar16) {
            auVar34 = *(undefined1 (*) [16])(above + uVar12 + (long)iVar7);
            auVar1 = *(undefined1 (*) [16])(above + uVar12 + (long)iVar7 + 1);
            auVar24 = pmovzxbw(auVar21,auVar34);
            auVar42 = pmovzxbw(in_XMM7,auVar1);
            auVar25 = psllw(auVar24,5);
            sVar18 = auVar19._0_2_;
            in_XMM7._0_2_ = (auVar42._0_2_ - auVar24._0_2_) * sVar18;
            sVar20 = auVar19._2_2_;
            in_XMM7._2_2_ = (auVar42._2_2_ - auVar24._2_2_) * sVar20;
            in_XMM7._4_2_ = (auVar42._4_2_ - auVar24._4_2_) * sVar18;
            in_XMM7._6_2_ = (auVar42._6_2_ - auVar24._6_2_) * sVar20;
            in_XMM7._8_2_ = (auVar42._8_2_ - auVar24._8_2_) * sVar18;
            in_XMM7._10_2_ = (auVar42._10_2_ - auVar24._10_2_) * sVar20;
            in_XMM7._12_2_ = (auVar42._12_2_ - auVar24._12_2_) * sVar18;
            in_XMM7._14_2_ = (auVar42._14_2_ - auVar24._14_2_) * sVar20;
            uVar23 = (ushort)(auVar25._0_2_ + auVar22._0_2_ + in_XMM7._0_2_) >> 5;
            uVar26 = (ushort)(auVar25._2_2_ + auVar22._2_2_ + in_XMM7._2_2_) >> 5;
            uVar27 = (ushort)(auVar25._4_2_ + auVar22._4_2_ + in_XMM7._4_2_) >> 5;
            uVar28 = (ushort)(auVar25._6_2_ + auVar22._6_2_ + in_XMM7._6_2_) >> 5;
            uVar29 = (ushort)(auVar25._8_2_ + auVar22._8_2_ + in_XMM7._8_2_) >> 5;
            uVar30 = (ushort)(auVar25._10_2_ + auVar22._10_2_ + in_XMM7._10_2_) >> 5;
            uVar31 = (ushort)(auVar25._12_2_ + auVar22._12_2_ + in_XMM7._12_2_) >> 5;
            uVar32 = (ushort)(auVar25._14_2_ + auVar22._14_2_ + in_XMM7._14_2_) >> 5;
            auVar24._0_2_ = CONCAT11(0,auVar34[8]);
            auVar24[2] = auVar34[9];
            auVar24[3] = 0;
            auVar24[4] = auVar34[10];
            auVar24[5] = 0;
            auVar24[6] = auVar34[0xb];
            auVar24[7] = 0;
            auVar24[8] = auVar34[0xc];
            auVar24[9] = 0;
            auVar24[10] = auVar34[0xd];
            auVar24[0xb] = 0;
            auVar24[0xc] = auVar34[0xe];
            auVar24[0xd] = 0;
            auVar24[0xe] = auVar34[0xf];
            auVar24[0xf] = 0;
            auVar25 = psllw(auVar24,5);
            uVar33 = (ushort)(auVar25._0_2_ + auVar22._0_2_ + (auVar1[8] - auVar24._0_2_) * sVar18)
                     >> 5;
            uVar35 = (ushort)(auVar25._2_2_ + auVar22._2_2_ +
                             ((ushort)auVar1[9] - (ushort)auVar34[9]) * sVar20) >> 5;
            uVar36 = (ushort)(auVar25._4_2_ + auVar22._4_2_ +
                             ((ushort)auVar1[10] - (ushort)auVar34[10]) * sVar18) >> 5;
            uVar37 = (ushort)(auVar25._6_2_ + auVar22._6_2_ +
                             ((ushort)auVar1[0xb] - (ushort)auVar34[0xb]) * sVar20) >> 5;
            uVar38 = (ushort)(auVar25._8_2_ + auVar22._8_2_ +
                             ((ushort)auVar1[0xc] - (ushort)auVar34[0xc]) * sVar18) >> 5;
            uVar39 = (ushort)(auVar25._10_2_ + auVar22._10_2_ +
                             ((ushort)auVar1[0xd] - (ushort)auVar34[0xd]) * sVar20) >> 5;
            uVar40 = (ushort)(auVar25._12_2_ + auVar22._12_2_ +
                             ((ushort)auVar1[0xe] - (ushort)auVar34[0xe]) * sVar18) >> 5;
            uVar41 = (ushort)(auVar25._14_2_ + auVar22._14_2_ +
                             ((ushort)auVar1[0xf] - (ushort)auVar34[0xf]) * sVar20) >> 5;
            auVar34[1] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
            auVar34[0] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
            auVar34[2] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
            auVar34[3] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
            auVar34[4] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
            auVar34[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
            auVar34[6] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
            auVar34[7] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
            auVar34[8] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
            auVar34[9] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
            auVar34[10] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
            auVar34[0xb] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
            auVar34[0xc] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
            auVar34[0xd] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
            auVar34[0xe] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
            auVar34[0xf] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          }
          *pauVar17 = auVar34;
          pauVar17 = pauVar17 + 1;
          uVar12 = 0x10;
          bVar3 = false;
        } while (bVar6);
        uVar8 = 0x20;
        if (uVar16 < 0x20) {
          uVar8 = uVar16;
        }
        auVar19 = pblendvb(auVar21,local_858,*(undefined1 (*) [16])(Mask[0][0] + (uVar8 << 4)));
        auVar34 = pblendvb(auVar21,local_848,*(undefined1 (*) [16])(Mask[1][0] + (uVar8 << 4)));
        *(undefined1 (*) [16])(local_438 + uVar9 * 2) = auVar19;
        *(undefined1 (*) [16])(local_838 + uVar9 * 2) = auVar34;
        uVar10 = uVar10 + upsample_above;
      }
      if ((int)uVar16 < 1) break;
      uVar9 = uVar9 + 1;
      puVar13 = puVar13 + 2;
      puVar14 = puVar14 + 2;
      uVar15 = uVar15 - 1;
    } while (uVar9 != uVar4);
    if (0 < N) {
      puVar11 = dst + 0x10;
      lVar5 = 0;
      do {
        uVar2 = *(undefined8 *)((long)local_438 + lVar5 + 8);
        *(undefined8 *)(puVar11 + -0x10) = *(undefined8 *)((long)local_438 + lVar5);
        *(undefined8 *)(puVar11 + -8) = uVar2;
        uVar2 = *(undefined8 *)((long)local_838 + lVar5 + 8);
        *(undefined8 *)puVar11 = *(undefined8 *)((long)local_838 + lVar5);
        *(undefined8 *)(puVar11 + 8) = uVar2;
        lVar5 = lVar5 + 0x10;
        puVar11 = puVar11 + stride;
      } while (uVar4 * 0x10 != lVar5);
    }
  }
  return;
}

Assistant:

static AOM_FORCE_INLINE void dr_prediction_z1_32xN_internal_sse4_1(
    int N, __m128i *dstvec, __m128i *dstvec_h, const uint8_t *above,
    int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((32 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0, a1, a32, a16;
  __m128i a_mbase_x, diff, c3f;

  a16 = _mm_set1_epi16(16);
  a_mbase_x = _mm_set1_epi8((char)above[max_base_x]);
  c3f = _mm_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++) {
    __m128i b, res, res1, res16[2];
    __m128i a0_above, a1_above;

    int base = x >> frac_bits;
    int base_max_diff = (max_base_x - base);
    if (base_max_diff <= 0) {
      for (int i = r; i < N; ++i) {
        dstvec[i] = a_mbase_x;  // save 32 values
        dstvec_h[i] = a_mbase_x;
      }
      return;
    }
    if (base_max_diff > 32) base_max_diff = 32;
    __m128i shift = _mm_srli_epi16(_mm_and_si128(_mm_set1_epi16(x), c3f), 1);

    for (int j = 0, jj = 0; j < 32; j += 16, jj++) {
      int mdiff = base_max_diff - j;
      if (mdiff <= 0) {
        res16[jj] = a_mbase_x;
      } else {
        a0_above = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_above = _mm_loadu_si128((__m128i *)(above + base + j + 1));

        // lower half
        a0 = _mm_cvtepu8_epi16(a0_above);
        a1 = _mm_cvtepu8_epi16(a1_above);

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm_mullo_epi16(diff, shift);

        res = _mm_add_epi16(a32, b);
        res = _mm_srli_epi16(res, 5);

        // uppar half
        a0 = _mm_cvtepu8_epi16(_mm_srli_si128(a0_above, 8));
        a1 = _mm_cvtepu8_epi16(_mm_srli_si128(a1_above, 8));

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16

        b = _mm_mullo_epi16(diff, shift);
        res1 = _mm_add_epi16(a32, b);
        res1 = _mm_srli_epi16(res1, 5);

        res16[jj] = _mm_packus_epi16(res, res1);  // 16 8bit values
      }
    }

    dstvec[r] =
        _mm_blendv_epi8(a_mbase_x, res16[0],
                        *(__m128i *)Mask[0][base_max_diff]);  // 16 8bit values

    dstvec_h[r] =
        _mm_blendv_epi8(a_mbase_x, res16[1],
                        *(__m128i *)Mask[1][base_max_diff]);  // 16 8bit values
    x += dx;
  }
}